

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O1

void __thiscall
duckdb::Pipeline::ScheduleSequentialTask(Pipeline *this,shared_ptr<duckdb::Event,_true> *event)

{
  Event *this_00;
  enable_shared_from_this<duckdb::Task> *object;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_true> tasks;
  _Head_base<0UL,_duckdb::PipelineTask_*,_false> local_80;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  local_78;
  shared_ptr<duckdb::Event,_true> local_58;
  shared_ptr<duckdb::Task,_true> local_48;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  local_38;
  
  local_78.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80._M_head_impl = (PipelineTask *)operator_new(0x60);
  local_58.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (event->internal).super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_58.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (event->internal).super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount
         ._M_pi;
  if (local_58.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_58.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_58.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_58.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  PipelineTask::PipelineTask(local_80._M_head_impl,this,&local_58);
  if (local_58.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  ::std::__shared_ptr<duckdb::Task,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<duckdb::PipelineTask,std::default_delete<duckdb::PipelineTask>,void>
            ((__shared_ptr<duckdb::Task,(__gnu_cxx::_Lock_policy)2> *)&local_48,
             (unique_ptr<duckdb::PipelineTask,_std::default_delete<duckdb::PipelineTask>_> *)
             &local_80);
  object = &(local_48.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->super_enable_shared_from_this<duckdb::Task>;
  if (local_48.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (Task *)0x0) {
    object = (enable_shared_from_this<duckdb::Task> *)0x0;
  }
  shared_ptr<duckdb::Task,_true>::__enable_weak_this<duckdb::Task,_duckdb::Task,_0>
            (&local_48,object,
             local_48.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  ::std::
  vector<duckdb::shared_ptr<duckdb::Task,true>,std::allocator<duckdb::shared_ptr<duckdb::Task,true>>>
  ::emplace_back<duckdb::shared_ptr<duckdb::Task,true>>
            ((vector<duckdb::shared_ptr<duckdb::Task,true>,std::allocator<duckdb::shared_ptr<duckdb::Task,true>>>
              *)&local_78,&local_48);
  if (local_48.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_48.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_80._M_head_impl != (PipelineTask *)0x0) {
    (*((local_80._M_head_impl)->super_ExecutorTask).super_Task._vptr_Task[1])();
  }
  this_00 = shared_ptr<duckdb::Event,_true>::operator->(event);
  local_38.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_78.
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_38.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_78.
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_38.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_78.
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_78.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Event::SetTasks(this_00,(vector<duckdb::shared_ptr<duckdb::Task,_true>,_true> *)&local_38);
  ::std::
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ::~vector(&local_38);
  ::std::
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ::~vector(&local_78);
  return;
}

Assistant:

void Pipeline::ScheduleSequentialTask(shared_ptr<Event> &event) {
	vector<shared_ptr<Task>> tasks;
	tasks.push_back(make_uniq<PipelineTask>(*this, event));
	event->SetTasks(std::move(tasks));
}